

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::AssertHelper::~AssertHelper(AssertHelper *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    AssertHelperData::~AssertHelperData((AssertHelperData *)0x11f7e6);
    operator_delete(pvVar1,0x38);
  }
  return;
}

Assistant:

AssertHelper::~AssertHelper() { delete data_; }